

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O2

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::middleSplit_(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
               *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                     *obj,unsigned_long *ind,unsigned_long count,unsigned_long *index,int *cutfeat,
              DistanceType *cutval,BoundingBox *bbox)

{
  int element;
  long lVar1;
  ulong uVar2;
  ElementType *pEVar3;
  double dVar4;
  double dVar5;
  ElementType max_elem;
  ElementType min_elem;
  unsigned_long lim2;
  unsigned_long lim1;
  double local_70;
  double local_60;
  double local_58;
  unsigned_long *local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  dVar5 = bbox->_M_elems[0].high - bbox->_M_elems[0].low;
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 0x10) {
    dVar4 = *(double *)((long)&bbox->_M_elems[1].high + lVar1) -
            *(double *)((long)&bbox->_M_elems[1].low + lVar1);
    if (dVar4 <= dVar5) {
      dVar4 = dVar5;
    }
    dVar5 = dVar4;
  }
  *cutfeat = 0;
  dVar5 = dVar5 * 0.99999;
  pEVar3 = &bbox->_M_elems[0].high;
  local_70 = -1.0;
  local_50 = index;
  local_48 = dVar5;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    if (dVar5 < *pEVar3 - ((Interval *)(pEVar3 + -1))->low) {
      computeMinMax(this,obj,ind,count,(int)lVar1,&local_58,&local_60);
      dVar5 = local_48;
      if (local_70 < local_60 - local_58) {
        *cutfeat = (int)lVar1;
        local_70 = local_60 - local_58;
      }
    }
    pEVar3 = pEVar3 + 2;
  }
  element = *cutfeat;
  dVar5 = (bbox->_M_elems[element].low + bbox->_M_elems[element].high) * 0.5;
  computeMinMax(this,obj,ind,count,element,&local_58,&local_60);
  if ((local_58 <= dVar5) && (local_58 = local_60, dVar5 <= local_60)) {
    local_58 = dVar5;
  }
  *cutval = local_58;
  planeSplit(this,obj,ind,count,*cutfeat,cutval,&local_38,&local_40);
  uVar2 = count >> 1;
  if (uVar2 <= local_40) {
    local_40 = uVar2;
  }
  if (uVar2 < local_38) {
    local_40 = local_38;
  }
  *local_50 = local_40;
  return;
}

Assistant:

void middleSplit_(Derived &obj, IndexType *ind, IndexType count,
                    IndexType &index, int &cutfeat, DistanceType &cutval,
                    const BoundingBox &bbox) {
    const DistanceType EPS = static_cast<DistanceType>(0.00001);
    ElementType max_span = bbox[0].high - bbox[0].low;
    for (int i = 1; i < (DIM > 0 ? DIM : obj.dim); ++i) {
      ElementType span = bbox[i].high - bbox[i].low;
      if (span > max_span) {
        max_span = span;
      }
    }
    ElementType max_spread = -1;
    cutfeat = 0;
    for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
      ElementType span = bbox[i].high - bbox[i].low;
      if (span > (1 - EPS) * max_span) {
        ElementType min_elem, max_elem;
        computeMinMax(obj, ind, count, i, min_elem, max_elem);
        ElementType spread = max_elem - min_elem;
        ;
        if (spread > max_spread) {
          cutfeat = i;
          max_spread = spread;
        }
      }
    }
    // split in the middle
    DistanceType split_val = (bbox[cutfeat].low + bbox[cutfeat].high) / 2;
    ElementType min_elem, max_elem;
    computeMinMax(obj, ind, count, cutfeat, min_elem, max_elem);

    if (split_val < min_elem)
      cutval = min_elem;
    else if (split_val > max_elem)
      cutval = max_elem;
    else
      cutval = split_val;

    IndexType lim1, lim2;
    planeSplit(obj, ind, count, cutfeat, cutval, lim1, lim2);

    if (lim1 > count / 2)
      index = lim1;
    else if (lim2 < count / 2)
      index = lim2;
    else
      index = count / 2;
  }